

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::IntegerLiteral::IntegerLiteral
          (IntegerLiteral *this,BumpAllocator *alloc,Type *type,SVInt *value,bool isDeclaredUnsized,
          SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  bool bVar1;
  bool unknownFlag;
  bitwidth_t bits;
  uint32_t uVar2;
  byte *pbVar3;
  uint64_t *puVar4;
  Expression *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  long in_RDI;
  byte in_R8B;
  Type *in_stack_ffffffffffffff80;
  SVInt *this_00;
  size_t in_stack_ffffffffffffff88;
  Expression *size;
  
  sourceRange_00.endLoc = in_RSI;
  sourceRange_00.startLoc = in_RDX;
  size = in_RCX;
  Expression::Expression
            (in_RCX,(ExpressionKind)(in_stack_ffffffffffffff88 >> 0x20),in_stack_ffffffffffffff80,
             sourceRange_00);
  *(byte *)(in_RDI + 0x30) = in_R8B & 1;
  bits = SVInt::getBitWidth((SVInt *)in_RCX);
  bVar1 = SVInt::isSigned((SVInt *)in_RCX);
  unknownFlag = SVInt::hasUnknown((SVInt *)in_RCX);
  SVIntStorage::SVIntStorage((SVIntStorage *)(in_RDI + 0x38),bits,bVar1,unknownFlag);
  bVar1 = SVInt::isSingleWord((SVInt *)in_RCX);
  if (bVar1) {
    puVar4 = SVInt::getRawPtr((SVInt *)in_stack_ffffffffffffff80);
    *(uint64_t *)(in_RDI + 0x38) = *puVar4;
  }
  else {
    SVInt::getNumWords((SVInt *)0x81fbda);
    pbVar3 = BumpAllocator::allocate((BumpAllocator *)in_RDX,(size_t)size,in_stack_ffffffffffffff88)
    ;
    *(byte **)(in_RDI + 0x38) = pbVar3;
    this_00 = *(SVInt **)(in_RDI + 0x38);
    puVar4 = SVInt::getRawPtr(this_00);
    uVar2 = SVInt::getNumWords((SVInt *)0x81fc1e);
    memcpy(this_00,puVar4,(ulong)uVar2 << 3);
  }
  return;
}

Assistant:

IntegerLiteral::IntegerLiteral(BumpAllocator& alloc, const Type& type, const SVInt& value,
                               bool isDeclaredUnsized, SourceRange sourceRange) :
    Expression(ExpressionKind::IntegerLiteral, type, sourceRange),
    isDeclaredUnsized(isDeclaredUnsized),
    valueStorage(value.getBitWidth(), value.isSigned(), value.hasUnknown()) {

    if (value.isSingleWord())
        valueStorage.val = *value.getRawPtr();
    else {
        valueStorage.pVal = (uint64_t*)alloc.allocate(sizeof(uint64_t) * value.getNumWords(),
                                                      alignof(uint64_t));
        memcpy(valueStorage.pVal, value.getRawPtr(), sizeof(uint64_t) * value.getNumWords());
    }
}